

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ParamListStandard::restoreXml
          (ParamListStandard *this,Element *el,AddrSpaceManager *manage,
          vector<EffectRecord,_std::allocator<EffectRecord>_> *effectlist,bool normalstack)

{
  int iVar1;
  pointer pbVar2;
  Element *el_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined7 extraout_var;
  LowlevelError *pLVar6;
  int iVar7;
  long lVar8;
  _List_node_base *p_Var9;
  undefined3 in_register_00000081;
  pointer ppEVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_1d9;
  list<ParamEntry,_std::allocator<ParamEntry>_> *local_1d8;
  undefined4 local_1cc;
  ulong local_1c8;
  vector<EffectRecord,_std::allocator<EffectRecord>_> *local_1c0;
  AddrSpaceManager *local_1b8;
  istringstream i1;
  uint auStack_198 [90];
  
  local_1cc = CONCAT31(in_register_00000081,normalstack);
  this->numgroup = 0;
  this->spacebase = (AddrSpace *)0x0;
  local_1d8 = (list<ParamEntry,_std::allocator<ParamEntry>_> *)&this->pointermax;
  this->pointermax = 0;
  this->thisbeforeret = false;
  lVar8 = 0;
  local_1c8 = 0;
  local_1c0 = effectlist;
  local_1b8 = manage;
  for (lVar11 = 0;
      pbVar2 = (el->attr).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar11 < (int)((ulong)((long)(el->attr).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5);
      lVar11 = lVar11 + 1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(pbVar2->_M_dataplus)._M_p + lVar8);
    bVar3 = std::operator==(__lhs,"pointermax");
    if (bVar3) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&i1,
                 (string *)
                 ((long)&(((el->value).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 _S_in);
      *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) =
           *(uint *)((long)auStack_198 + *(long *)(_i1 + -0x18)) & 0xffffffb5;
      std::istream::operator>>((istringstream *)&i1,(int *)local_1d8);
      std::__cxx11::istringstream::~istringstream((istringstream *)&i1);
    }
    else {
      bVar3 = std::operator==(__lhs,"thisbeforeretpointer");
      if (bVar3) {
        bVar3 = xml_readbool((string *)
                             ((long)&(((el->value).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8));
        this->thisbeforeret = bVar3;
      }
      else {
        bVar3 = std::operator==(__lhs,"killedbycall");
        if (bVar3) {
          bVar3 = xml_readbool((string *)
                               ((long)&(((el->value).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar8));
          local_1c8 = CONCAT71(extraout_var,bVar3);
        }
      }
    }
    lVar8 = lVar8 + 0x20;
  }
  this->nonfloatgroup = -1;
  ppEVar10 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1d8 = &this->entry;
  iVar5 = -1;
  bVar3 = local_1cc._0_1_;
  do {
    if (ppEVar10 ==
        (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      calcDelay(this);
      populateResolver(this);
      return;
    }
    el_00 = *ppEVar10;
    bVar4 = std::operator==(&el_00->name,"pentry");
    if (bVar4) {
      std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::push_back
                (local_1d8,(value_type *)&i1);
      ParamEntry::restoreXml
                ((ParamEntry *)
                 ((this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
                  _M_node.super__List_node_base._M_prev + 1),el_00,local_1b8,bVar3);
      p_Var9 = (this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      if (*(int *)((long)&p_Var9[1]._M_next + 4) == 3) {
        if (-1 < this->nonfloatgroup) {
          pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    ((string *)&i1,"parameter list floating-point entries must come first",
                     &local_1d9);
          LowlevelError::LowlevelError(pLVar6,(string *)&i1);
          __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
      }
      else if (this->nonfloatgroup < 0) {
        this->nonfloatgroup = this->numgroup;
      }
      if (((AddrSpace *)p_Var9[2]._M_next)->type == 2) {
        this->spacebase = (AddrSpace *)p_Var9[2]._M_next;
      }
      else if ((local_1c8 & 1) != 0) {
        EffectRecord::EffectRecord((EffectRecord *)&i1,(ParamEntry *)(p_Var9 + 1),2);
        std::vector<EffectRecord,_std::allocator<EffectRecord>_>::emplace_back<EffectRecord>
                  (local_1c0,(EffectRecord *)&i1);
        p_Var9 = (this->entry).super__List_base<ParamEntry,_std::allocator<ParamEntry>_>._M_impl.
                 _M_node.super__List_node_base._M_prev;
      }
      iVar1 = *(int *)&p_Var9[1]._M_prev;
      iVar7 = *(int *)((long)&p_Var9[1]._M_prev + 4) + iVar1;
      if (this->numgroup < iVar7) {
        this->numgroup = iVar7;
      }
      bVar4 = iVar1 < iVar5;
      iVar5 = iVar1;
      if (bVar4) {
        pLVar6 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)&i1,"pentrys must come in group order",&local_1d9);
        LowlevelError::LowlevelError(pLVar6,(string *)&i1);
        __cxa_throw(pLVar6,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
    }
    ppEVar10 = ppEVar10 + 1;
  } while( true );
}

Assistant:

void ParamListStandard::restoreXml(const Element *el,const AddrSpaceManager *manage,
				   vector<EffectRecord> &effectlist,bool normalstack)

{
  int4 lastgroup = -1;
  numgroup = 0;
  spacebase = (AddrSpace *)0;
  pointermax = 0;
  thisbeforeret = false;
  bool autokilledbycall = false;
  for(int4 i=0;i<el->getNumAttributes();++i) {
    const string &attrname( el->getAttributeName(i) );
    if (attrname == "pointermax") {
      istringstream i1(el->getAttributeValue(i));
      i1.unsetf(ios::dec | ios::hex | ios::oct);
      i1 >> pointermax;
    }
    else if (attrname == "thisbeforeretpointer") {
      thisbeforeret = xml_readbool( el->getAttributeValue(i) );
    }
    else if (attrname == "killedbycall") {
      autokilledbycall = xml_readbool( el->getAttributeValue(i) );
    }
  }
  nonfloatgroup = -1;		// We haven't seen any integer slots yet
  const List &flist(el->getChildren());
  List::const_iterator fiter;
  for(fiter=flist.begin();fiter!=flist.end();++fiter) {
    const Element *subel = *fiter;
    if (subel->getName() == "pentry") {
      entry.push_back(ParamEntry(numgroup));
      entry.back().restoreXml(subel,manage,normalstack);
      if (entry.back().getType()==TYPE_FLOAT) {
	  if (nonfloatgroup >= 0)
	    throw LowlevelError("parameter list floating-point entries must come first");
      }
      else if (nonfloatgroup < 0)
	nonfloatgroup = numgroup; // First time we have seen an integer slot
      AddrSpace *spc = entry.back().getSpace();
      if (spc->getType() == IPTR_SPACEBASE)
	spacebase = spc;
      else if (autokilledbycall)	// If a register parameter AND we automatically generate killedbycall
	effectlist.push_back(EffectRecord(entry.back(),EffectRecord::killedbycall));

      int4 maxgroup = entry.back().getGroup() + entry.back().getGroupSize();
      if (maxgroup > numgroup)
	numgroup = maxgroup;
      if (entry.back().getGroup() < lastgroup)
	throw LowlevelError("pentrys must come in group order");
      lastgroup = entry.back().getGroup();
    }
  }
  calcDelay();
  populateResolver();
}